

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O1

int xml_print_data(lyout *out,lyd_node *root,int options)

{
  LYS_NODE LVar1;
  int iVar2;
  int *piVar3;
  lyd_node *plVar4;
  lys_node *node;
  lyd_node *plVar5;
  ulong uVar6;
  char *pcVar7;
  uint level;
  bool bVar8;
  bool bVar9;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (root == (lyd_node *)0x0) {
    if ((out->type & ~LYOUT_STREAM) == LYOUT_MEMORY) {
      ly_print(out,"");
    }
    goto LAB_00197726;
  }
  bVar8 = true;
  if (((uint)options >> 8 & 1) != 0) {
    plVar5 = root;
    if (root->schema->nodetype != LYS_RPC) {
      do {
        LVar1 = plVar5->schema->nodetype;
        if (LVar1 == LYS_ACTION) goto LAB_00197617;
        if ((LVar1 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          plVar4 = plVar5->child;
        }
        else {
          plVar4 = (lyd_node *)0x0;
        }
        if (plVar4 == (lyd_node *)0x0) {
          if (plVar5 == root) goto LAB_00197617;
          plVar4 = plVar5->next;
        }
        if (plVar4 == (lyd_node *)0x0) {
          for (plVar5 = plVar5->parent;
              (plVar5->parent != root->parent && (plVar4 = plVar5->next, plVar4 == (lyd_node *)0x0))
              ; plVar5 = plVar5->parent) {
          }
        }
        plVar5 = plVar4;
      } while (plVar4 != (lyd_node *)0x0);
      plVar5 = (lyd_node *)0x0;
    }
LAB_00197617:
    if (plVar5 != (lyd_node *)0x0) {
      if (((plVar5->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) ==
           LYS_UNKNOWN) || (plVar5->child == (lyd_node *)0x0)) {
LAB_0019764e:
        node = (lys_node *)0x0;
      }
      else {
        node = plVar5->child->schema;
        do {
          node = lys_parent(node);
          if (node == (lys_node *)0x0) goto LAB_0019764e;
        } while (node->nodetype == LYS_USES);
      }
      if ((node == (lys_node *)0x0) || (node->nodetype != LYS_OUTPUT)) {
        bVar8 = plVar5->schema->nodetype != LYS_ACTION;
        goto LAB_00197673;
      }
      root = plVar5->child;
    }
    bVar8 = true;
  }
LAB_00197673:
  level = options & 2;
  if (bVar8) {
    level = level >> 1;
  }
  else {
    pcVar7 = "\n";
    if (level == 0) {
      pcVar7 = "";
    }
    ly_print(out,"%*s<action xmlns=\"urn:ietf:params:xml:ns:yang:1\">%s",0,"",pcVar7);
  }
  for (; root != (lyd_node *)0x0; root = root->next) {
    iVar2 = xml_print_node(out,level,root,1,options);
    if (iVar2 != 0) {
      return 1;
    }
    if ((options & 1U) == 0) break;
  }
  if (!bVar8) {
    bVar8 = level == 0;
    iVar2 = level - 1;
    bVar9 = iVar2 == 0;
    if (bVar8) {
      iVar2 = 0;
    }
    uVar6 = (ulong)(iVar2 * 2 - 2);
    if (bVar8 || bVar9) {
      uVar6 = 0;
    }
    pcVar7 = "\n";
    if (bVar8 || bVar9) {
      pcVar7 = "";
    }
    ly_print(out,"%*s</action>%s",uVar6,"",pcVar7);
  }
LAB_00197726:
  ly_print_flush(out);
  iVar2 = *piVar3;
  if (iVar2 != 0) {
    pcVar7 = strerror(iVar2);
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar7);
  }
  return (uint)(iVar2 != 0);
}

Assistant:

int
xml_print_data(struct lyout *out, const struct lyd_node *root, int options)
{
    const struct lyd_node *node, *next;
    struct lys_node *parent = NULL;
    int level, action_input = 0;

    LY_PRINT_SET;

    if (!root) {
        if (out->type == LYOUT_MEMORY || out->type == LYOUT_CALLBACK) {
            ly_print(out, "");
        }
        goto finish;
    }

    level = (options & LYP_FORMAT ? 1 : 0);

    if (options & LYP_NETCONF) {
        if (root->schema->nodetype != LYS_RPC) {
            /* learn whether we are printing an action */
            LY_TREE_DFS_BEGIN(root, next, node) {
                if (node->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(root, next, node);
            }
        } else {
            node = root;
        }

        if (node) {
            if ((node->schema->nodetype & (LYS_LIST | LYS_CONTAINER | LYS_RPC | LYS_NOTIF | LYS_ACTION)) && node->child) {
                for (parent = lys_parent(node->child->schema); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
            }
            if (parent && (parent->nodetype == LYS_OUTPUT)) {
                /* rpc/action output - skip the container */
                root = node->child;
            } else if (node->schema->nodetype == LYS_ACTION) {
                /* action input - print top-level action element */
                action_input = 1;
            }
        }
    }

    if (action_input) {
        ly_print(out, "%*s<action xmlns=\"urn:ietf:params:xml:ns:yang:1\">%s", LEVEL, INDENT, level ? "\n" : "");
        if (level) {
            ++level;
        }
    }

    /* content */
    LY_TREE_FOR(root, node) {
        if (xml_print_node(out, level, node, 1, options)) {
            return EXIT_FAILURE;
        }
        if (!(options & LYP_WITHSIBLINGS)) {
            break;
        }
    }

    if (action_input) {
        if (level) {
            --level;
        }
        ly_print(out, "%*s</action>%s", LEVEL, INDENT, level ? "\n" : "");
    }

finish:
    ly_print_flush(out);

    LY_PRINT_RET(NULL);
}